

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

void ConvertRowToY(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,uint8_t *dst_y,int width,
                  VP8Random *rg)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar5;
  int iVar4;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = 0;
  uVar6 = (ulong)(uint)width;
  if (width < 1) {
    uVar6 = uVar7;
  }
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    bVar1 = r_ptr[uVar7];
    bVar2 = g_ptr[uVar7];
    bVar3 = b_ptr[uVar7];
    if (rg == (VP8Random *)0x0) {
      uVar5 = (uint8_t)((uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                        0x108000 >> 0x10);
    }
    else {
      iVar4 = VP8RandomBits(rg,0x10);
      uVar5 = (uint8_t)(iVar4 + (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                        0x100000 >> 0x10);
    }
    dst_y[uVar8] = uVar5;
    uVar7 = uVar7 + (long)step;
  }
  return;
}

Assistant:

static WEBP_INLINE void ConvertRowToY(const uint8_t* const r_ptr,
                                      const uint8_t* const g_ptr,
                                      const uint8_t* const b_ptr,
                                      int step,
                                      uint8_t* const dst_y,
                                      int width,
                                      VP8Random* const rg) {
  int i, j;
  for (i = 0, j = 0; i < width; i += 1, j += step) {
    dst_y[i] = RGBToY(r_ptr[j], g_ptr[j], b_ptr[j], rg);
  }
}